

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::UnaryOperatorWrapper,duckdb::TryAbsOperator>
               (uhugeint_t *ldata,uhugeint_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  ulong uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  idx_t idx_in_entry;
  ulong uVar8;
  uint64_t *puVar9;
  sel_t *psVar10;
  uhugeint_t uVar11;
  uhugeint_t uVar12;
  uhugeint_t local_78;
  uhugeint_t *local_60;
  buffer_ptr<ValidityBuffer> *local_58;
  sel_t *local_50;
  ValidityMask *local_48;
  uhugeint_t local_40;
  
  local_60 = ldata;
  local_48 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar10 = sel_vector->sel_vector;
      puVar9 = &result_data->upper;
      uVar8 = 0;
      do {
        uVar6 = uVar8;
        if (psVar10 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar10[uVar8];
        }
        local_78.lower = local_60[uVar6].lower;
        local_78.upper = local_60[uVar6].upper;
        uhugeint_t::uhugeint_t(&local_40,0);
        bVar5 = uhugeint_t::operator<(&local_78,&local_40);
        if (bVar5) {
          uVar12 = uhugeint_t::operator-(&local_78);
        }
        else {
          uVar12.upper = local_78.upper;
          uVar12.lower = local_78.lower;
        }
        ((uhugeint_t *)(puVar9 + -1))->lower = uVar12.lower;
        *puVar9 = uVar12.upper;
        uVar8 = uVar8 + 1;
        puVar9 = puVar9 + 2;
      } while (count != uVar8);
    }
  }
  else if (count != 0) {
    psVar10 = sel_vector->sel_vector;
    local_58 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    puVar9 = &result_data->upper;
    uVar8 = 0;
    local_50 = psVar10;
    do {
      uVar6 = uVar8;
      if (psVar10 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar10[uVar8];
      }
      if (((local_48->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar6 >> 6] >>
           (uVar6 & 0x3f) & 1) == 0) {
        if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_40.lower = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_40.lower);
          uVar4 = local_78.upper;
          uVar3 = local_78.lower;
          local_78.lower = 0;
          local_78.upper = 0;
          this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar3;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.upper !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.upper);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_58);
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar2 = (byte)uVar8 & 0x3f;
        puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar8 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      else {
        local_78.lower = local_60[uVar6].lower;
        local_78.upper = local_60[uVar6].upper;
        uhugeint_t::uhugeint_t(&local_40,0);
        bVar5 = uhugeint_t::operator<(&local_78,&local_40);
        if (bVar5) {
          uVar11 = uhugeint_t::operator-(&local_78);
        }
        else {
          uVar11.upper = local_78.upper;
          uVar11.lower = local_78.lower;
        }
        ((uhugeint_t *)(puVar9 + -1))->lower = uVar11.lower;
        *puVar9 = uVar11.upper;
        psVar10 = local_50;
      }
      uVar8 = uVar8 + 1;
      puVar9 = puVar9 + 2;
    } while (count != uVar8);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}